

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O0

llama_batch * llama_batch_get_one(llama_token *tokens,int32_t n_tokens)

{
  int32_t in_EDX;
  llama_token *in_RSI;
  llama_batch *in_RDI;
  
  memset(in_RDI,0,0x38);
  in_RDI->n_tokens = in_EDX;
  in_RDI->token = in_RSI;
  return in_RDI;
}

Assistant:

struct llama_batch llama_batch_get_one(
             llama_token * tokens,
                 int32_t   n_tokens) {
    return {
        /*n_tokens       =*/ n_tokens,
        /*tokens         =*/ tokens,
        /*embd           =*/ nullptr,
        /*pos            =*/ nullptr,
        /*n_seq_id       =*/ nullptr,
        /*seq_id         =*/ nullptr,
        /*logits         =*/ nullptr,
    };
}